

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
erase(Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> *this,
     Bucket bucket)

{
  size_t sVar1;
  ulong uVar2;
  size_t bucket_00;
  Span<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> *this_00;
  long in_FS_OFFSET;
  Bucket local_50;
  Bucket local_40;
  long local_30;
  
  bucket_00 = bucket.index;
  this_00 = bucket.span;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  Span<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::erase
            (this_00,bucket_00);
  this->size = this->size - 1;
  local_40.span = this_00;
  local_40.index = bucket_00;
  do {
    Bucket::advanceWrapped(&local_40,this);
    if ((local_40.span)->offsets[local_40.index] == 0xff) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
        __stack_chk_fail();
      }
      return;
    }
    sVar1 = calculateHash<QFontDatabasePrivate::ExtendedScript>
                      ((ExtendedScript *)
                       ((local_40.span)->entries + (local_40.span)->offsets[local_40.index]),
                       this->seed);
    uVar2 = this->numBuckets - 1 & sVar1;
    local_50.span = this->spans + (uVar2 >> 7);
    local_50.index = (size_t)((uint)uVar2 & 0x7f);
    while (local_50.index != local_40.index || local_50.span != local_40.span) {
      if ((local_50.span == this_00) && (local_50.index == bucket_00)) {
        if (local_40.span == this_00) {
          this_00->offsets[bucket_00] = this_00->offsets[local_40.index];
          this_00->offsets[local_40.index] = 0xff;
          bucket_00 = local_40.index;
          this_00 = local_40.span;
        }
        else {
          Span<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
          moveFromSpan(this_00,local_40.span,local_40.index,bucket_00);
          bucket_00 = local_40.index;
          this_00 = local_40.span;
        }
        break;
      }
      Bucket::advanceWrapped(&local_50,this);
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }